

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

TPZManVector<std::complex<long_double>,_1000> * __thiscall
TPZManVector<std::complex<long_double>,_1000>::operator=
          (TPZManVector<std::complex<long_double>,_1000> *this,
          TPZManVector<std::complex<long_double>,_1000> *copy)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  complex<long_double> *pcVar6;
  long lVar7;
  complex<long_double> *pcVar8;
  ulong uVar9;
  
  if (this == copy) {
    return this;
  }
  uVar9 = (copy->super_TPZVec<std::complex<long_double>_>).fNElements;
  lVar7 = (this->super_TPZVec<std::complex<long_double>_>).fNAlloc;
  if ((lVar7 < (long)uVar9) &&
     (pcVar8 = (this->super_TPZVec<std::complex<long_double>_>).fStore,
     pcVar8 != this->fExtAlloc && pcVar8 != (complex<long_double> *)0x0)) {
    operator_delete__(pcVar8);
    lVar7 = 0;
    (this->super_TPZVec<std::complex<long_double>_>).fStore = (complex<long_double> *)0x0;
    (this->super_TPZVec<std::complex<long_double>_>).fNAlloc = 0;
  }
  if ((long)uVar9 < 0x3e9) {
    pcVar8 = (this->super_TPZVec<std::complex<long_double>_>).fStore;
    if (pcVar8 != (complex<long_double> *)0x0 && pcVar8 != this->fExtAlloc) {
      operator_delete__(pcVar8);
    }
    (this->super_TPZVec<std::complex<long_double>_>).fNAlloc = 0;
    (this->super_TPZVec<std::complex<long_double>_>).fStore = this->fExtAlloc;
  }
  else {
    if ((long)uVar9 <= lVar7) {
      (this->super_TPZVec<std::complex<long_double>_>).fNElements = uVar9;
      goto LAB_012ee551;
    }
    pcVar6 = (complex<long_double> *)operator_new__(-(ulong)(uVar9 >> 0x3b != 0) | uVar9 * 0x20);
    pcVar8 = pcVar6;
    do {
      *(longdouble *)pcVar8->_M_value = (longdouble)0;
      *(longdouble *)((long)pcVar8->_M_value + 0x10) = (longdouble)0;
      pcVar8 = pcVar8 + 1;
    } while (pcVar8 != pcVar6 + uVar9);
    (this->super_TPZVec<std::complex<long_double>_>).fStore = pcVar6;
    (this->super_TPZVec<std::complex<long_double>_>).fNAlloc = uVar9;
  }
  (this->super_TPZVec<std::complex<long_double>_>).fNElements = uVar9;
  if ((long)uVar9 < 1) {
    return this;
  }
LAB_012ee551:
  lVar7 = 0;
  do {
    pcVar8 = (copy->super_TPZVec<std::complex<long_double>_>).fStore;
    pcVar6 = (this->super_TPZVec<std::complex<long_double>_>).fStore;
    puVar1 = (undefined8 *)(pcVar8->_M_value + lVar7);
    uVar3 = *puVar1;
    uVar4 = puVar1[1];
    puVar1 = (undefined8 *)(pcVar8->_M_value + lVar7 + 0x10);
    uVar5 = puVar1[1];
    puVar2 = (undefined8 *)(pcVar6->_M_value + lVar7 + 0x10);
    *puVar2 = *puVar1;
    puVar2[1] = uVar5;
    puVar1 = (undefined8 *)(pcVar6->_M_value + lVar7);
    *puVar1 = uVar3;
    puVar1[1] = uVar4;
    lVar7 = lVar7 + 0x20;
    uVar9 = uVar9 - 1;
  } while (uVar9 != 0);
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}